

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeEventPoolCloseIpcHandle(ze_event_pool_handle_t hEventPool)

{
  _ze_event_pool_handle_t *_key;
  ze_pfnEventPoolCloseIpcHandle_t pfnCloseIpcHandle;
  dditable_t *dditable;
  ze_result_t result;
  ze_event_pool_handle_t hEventPool_local;
  
  if (*(code **)(*(long *)(hEventPool + 8) + 0x478) == (code *)0x0) {
    hEventPool_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_event_pool_handle_t **)hEventPool;
    hEventPool_local._4_4_ = (**(code **)(*(long *)(hEventPool + 8) + 0x478))(_key);
    if (hEventPool_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_event_pool_handle_t_*>,__ze_event_pool_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_event_pool_handle_t_*>,__ze_event_pool_handle_t_*>
                  *)(context + 0x240),_key);
    }
  }
  return hEventPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolCloseIpcHandle(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->dditable;
        auto pfnCloseIpcHandle = dditable->ze.EventPool.pfnCloseIpcHandle;
        if( nullptr == pfnCloseIpcHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEventPool = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->handle;

        // forward to device-driver
        result = pfnCloseIpcHandle( hEventPool );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_event_pool_factory.release( hEventPool );

        return result;
    }